

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O0

REF_STATUS
ref_gather_plt_brick_zone
          (REF_GRID ref_grid,REF_CELL ref_cell,REF_INT ldim,REF_DBL *scalar,FILE *file)

{
  uint uVar1;
  size_t sVar2;
  double local_168;
  double local_160;
  REF_DBL local_158;
  REF_DBL local_150;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_LONG ref_private_status_reis_bi_8;
  REF_LONG ref_private_status_reis_ai_8;
  REF_LONG ref_private_status_reis_bi_7;
  REF_LONG ref_private_status_reis_ai_7;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_LONG ref_private_status_reis_bi_6;
  REF_LONG ref_private_status_reis_ai_6;
  REF_LONG ref_private_status_reis_bi_5;
  REF_LONG ref_private_status_reis_ai_5;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_LONG ref_private_status_reis_bi_4;
  REF_LONG ref_private_status_reis_ai_4;
  REF_LONG ref_private_status_reis_bi_3;
  REF_LONG ref_private_status_reis_ai_3;
  REF_LONG ref_private_status_reis_bi_2;
  REF_LONG ref_private_status_reis_ai_2;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT i;
  REF_INT ixyz;
  REF_INT node;
  double tempdata;
  double maxdata;
  double mindata;
  int connsharing;
  int varsharing;
  int passive;
  int dataformat;
  REF_GLOB *l2c;
  REF_GLOB nnode;
  REF_LONG ncell;
  REF_NODE pRStack_48;
  float zonemarker;
  REF_NODE ref_node;
  REF_MPI ref_mpi;
  FILE *file_local;
  REF_DBL *scalar_local;
  REF_CELL pRStack_20;
  REF_INT ldim_local;
  REF_CELL ref_cell_local;
  REF_GRID ref_grid_local;
  
  ref_node = (REF_NODE)ref_grid->mpi;
  pRStack_48 = ref_grid->node;
  ncell._4_4_ = 0x43958000;
  varsharing = 2;
  connsharing = 0;
  mindata._4_4_ = 0;
  mindata._0_4_ = 0xffffffff;
  ref_mpi = (REF_MPI)file;
  file_local = (FILE *)scalar;
  scalar_local._4_4_ = ldim;
  pRStack_20 = ref_cell;
  ref_cell_local = (REF_CELL)ref_grid;
  uVar1 = ref_grid_compact_cell_nodes
                    (ref_grid,ref_cell,(REF_GLOB *)&l2c,&nnode,(REF_GLOB **)&passive);
  if (uVar1 == 0) {
    if (((long)l2c < 1) || (nnode < 1)) {
      if (_passive != (REF_GLOB *)0x0) {
        free(_passive);
      }
      ref_grid_local._4_4_ = 0;
    }
    else {
      if (ref_node->max == 0) {
        sVar2 = fwrite((void *)((long)&ncell + 4),4,1,(FILE *)ref_mpi);
        if (sVar2 != 1) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x1053,"ref_gather_plt_brick_zone","zonemarker",1,sVar2);
          return 1;
        }
        for (ref_private_status_reis_ai._4_4_ = 0;
            ref_private_status_reis_ai._4_4_ < scalar_local._4_4_ + 3;
            ref_private_status_reis_ai._4_4_ = ref_private_status_reis_ai._4_4_ + 1) {
          sVar2 = fwrite(&varsharing,4,1,(FILE *)ref_mpi);
          if (sVar2 != 1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x1056,"ref_gather_plt_brick_zone","int",1,sVar2);
            return 1;
          }
        }
        sVar2 = fwrite(&connsharing,4,1,(FILE *)ref_mpi);
        if (sVar2 != 1) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x1059,"ref_gather_plt_brick_zone","int",1,sVar2);
          return 1;
        }
        sVar2 = fwrite((void *)((long)&mindata + 4),4,1,(FILE *)ref_mpi);
        if (sVar2 != 1) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x105a,"ref_gather_plt_brick_zone","int",1,sVar2);
          return 1;
        }
        sVar2 = fwrite(&mindata,4,1,(FILE *)ref_mpi);
        if (sVar2 != 1) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x105b,"ref_gather_plt_brick_zone","int",1,sVar2);
          return 1;
        }
      }
      for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < 3;
          ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
        maxdata = 1e+200;
        tempdata = -1e+200;
        for (i = 0; i < pRStack_48->max; i = i + 1) {
          if ((_passive[i] != -1) && (pRStack_48->ref_mpi->id == pRStack_48->part[i])) {
            if (pRStack_48->real[ref_private_macro_code_rss + i * 0xf] <= maxdata) {
              local_150 = pRStack_48->real[ref_private_macro_code_rss + i * 0xf];
            }
            else {
              local_150 = maxdata;
            }
            maxdata = local_150;
            if (tempdata < pRStack_48->real[ref_private_macro_code_rss + i * 0xf] ||
                tempdata == pRStack_48->real[ref_private_macro_code_rss + i * 0xf]) {
              local_158 = pRStack_48->real[ref_private_macro_code_rss + i * 0xf];
            }
            else {
              local_158 = tempdata;
            }
            tempdata = local_158;
          }
        }
        _ixyz = maxdata;
        uVar1 = ref_mpi_min((REF_MPI)ref_node,&ixyz,&maxdata,3);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x1068,"ref_gather_plt_brick_zone",(ulong)uVar1,"mpi min");
          return uVar1;
        }
        _ixyz = tempdata;
        uVar1 = ref_mpi_max((REF_MPI)ref_node,&ixyz,&tempdata,3);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x106a,"ref_gather_plt_brick_zone",(ulong)uVar1,"mpi max");
          return uVar1;
        }
        if (ref_node->max == 0) {
          sVar2 = fwrite(&maxdata,8,1,(FILE *)ref_mpi);
          if (sVar2 != 1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x106c,"ref_gather_plt_brick_zone","mindata",1,sVar2);
            return 1;
          }
          sVar2 = fwrite(&tempdata,8,1,(FILE *)ref_mpi);
          if (sVar2 != 1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x106d,"ref_gather_plt_brick_zone","maxdata",1,sVar2);
            return 1;
          }
        }
      }
      for (ref_private_status_reis_ai._4_4_ = 0;
          ref_private_status_reis_ai._4_4_ < scalar_local._4_4_;
          ref_private_status_reis_ai._4_4_ = ref_private_status_reis_ai._4_4_ + 1) {
        maxdata = 1e+200;
        tempdata = -1e+200;
        for (i = 0; i < pRStack_48->max; i = i + 1) {
          if ((_passive[i] != -1) && (pRStack_48->ref_mpi->id == pRStack_48->part[i])) {
            if (*(double *)
                 (&file_local->_flags +
                 (long)(ref_private_status_reis_ai._4_4_ + scalar_local._4_4_ * i) * 2) <= maxdata)
            {
              local_160 = *(double *)
                           (&file_local->_flags +
                           (long)(ref_private_status_reis_ai._4_4_ + scalar_local._4_4_ * i) * 2);
            }
            else {
              local_160 = maxdata;
            }
            maxdata = local_160;
            if (tempdata <
                *(double *)
                 (&file_local->_flags +
                 (long)(ref_private_status_reis_ai._4_4_ + scalar_local._4_4_ * i) * 2) ||
                tempdata ==
                *(double *)
                 (&file_local->_flags +
                 (long)(ref_private_status_reis_ai._4_4_ + scalar_local._4_4_ * i) * 2)) {
              local_168 = *(double *)
                           (&file_local->_flags +
                           (long)(ref_private_status_reis_ai._4_4_ + scalar_local._4_4_ * i) * 2);
            }
            else {
              local_168 = tempdata;
            }
            tempdata = local_168;
          }
        }
        _ixyz = maxdata;
        uVar1 = ref_mpi_min((REF_MPI)ref_node,&ixyz,&maxdata,3);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x107a,"ref_gather_plt_brick_zone",(ulong)uVar1,"mpi min");
          return uVar1;
        }
        _ixyz = tempdata;
        uVar1 = ref_mpi_max((REF_MPI)ref_node,&ixyz,&tempdata,3);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x107c,"ref_gather_plt_brick_zone",(ulong)uVar1,"mpi max");
          return uVar1;
        }
        if (ref_node->max == 0) {
          sVar2 = fwrite(&maxdata,8,1,(FILE *)ref_mpi);
          if (sVar2 != 1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x107e,"ref_gather_plt_brick_zone","mindata",1,sVar2);
            return 1;
          }
          sVar2 = fwrite(&tempdata,8,1,(FILE *)ref_mpi);
          if (sVar2 != 1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x107f,"ref_gather_plt_brick_zone","maxdata",1,sVar2);
            return 1;
          }
        }
      }
      uVar1 = ref_gather_node_tec_block
                        (pRStack_48,(REF_GLOB)l2c,_passive,scalar_local._4_4_,(REF_DBL *)file_local,
                         varsharing,(FILE *)ref_mpi);
      if (uVar1 == 0) {
        uVar1 = ref_gather_brick_tec(pRStack_48,pRStack_20,nnode,_passive,1,(FILE *)ref_mpi);
        if (uVar1 == 0) {
          if (_passive != (REF_GLOB *)0x0) {
            free(_passive);
          }
          ref_grid_local._4_4_ = 0;
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x1088,"ref_gather_plt_brick_zone",(ulong)uVar1,"c2n");
          ref_grid_local._4_4_ = uVar1;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x1085,"ref_gather_plt_brick_zone",(ulong)uVar1,"block points");
        ref_grid_local._4_4_ = uVar1;
      }
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0x104c
           ,"ref_gather_plt_brick_zone",(ulong)uVar1,"l2c");
    ref_grid_local._4_4_ = uVar1;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_plt_brick_zone(REF_GRID ref_grid,
                                                    REF_CELL ref_cell,
                                                    REF_INT ldim,
                                                    REF_DBL *scalar,
                                                    FILE *file) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  float zonemarker = 299.0;
  REF_LONG ncell;
  REF_GLOB nnode, *l2c;
  int dataformat = 2; /*1=Float, 2=Double*/
  int passive = 0;
  int varsharing = 0;
  int connsharing = -1;
  double mindata, maxdata, tempdata;
  REF_INT node, ixyz, i;

  RSS(ref_grid_compact_cell_nodes(ref_grid, ref_cell, &nnode, &ncell, &l2c),
      "l2c");
  if (nnode <= 0 || ncell <= 0) {
    ref_free(l2c);
    return REF_SUCCESS;
  }

  if (ref_mpi_once(ref_mpi)) {
    REIS(1, fwrite(&zonemarker, sizeof(float), 1, file), "zonemarker");

    for (i = 0; i < 3 + ldim; i++) {
      REIS(1, fwrite(&dataformat, sizeof(int), 1, file), "int");
    }

    REIS(1, fwrite(&passive, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&varsharing, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&connsharing, sizeof(int), 1, file), "int");
  }

  for (ixyz = 0; ixyz < 3; ixyz++) {
    mindata = REF_DBL_MAX;
    maxdata = REF_DBL_MIN;
    for (node = 0; node < ref_node_max(ref_node); node++) {
      if (REF_EMPTY != l2c[node] && ref_node_owned(ref_node, node)) {
        mindata = MIN(mindata, ref_node_xyz(ref_node, ixyz, node));
        maxdata = MAX(maxdata, ref_node_xyz(ref_node, ixyz, node));
      }
    }
    tempdata = mindata;
    RSS(ref_mpi_min(ref_mpi, &tempdata, &mindata, REF_DBL_TYPE), "mpi min");
    tempdata = maxdata;
    RSS(ref_mpi_max(ref_mpi, &tempdata, &maxdata, REF_DBL_TYPE), "mpi max");
    if (ref_mpi_once(ref_mpi)) {
      REIS(1, fwrite(&mindata, sizeof(double), 1, file), "mindata");
      REIS(1, fwrite(&maxdata, sizeof(double), 1, file), "maxdata");
    }
  }
  for (i = 0; i < ldim; i++) {
    mindata = REF_DBL_MAX;
    maxdata = REF_DBL_MIN;
    for (node = 0; node < ref_node_max(ref_node); node++) {
      if (REF_EMPTY != l2c[node] && ref_node_owned(ref_node, node)) {
        mindata = MIN(mindata, scalar[i + ldim * node]);
        maxdata = MAX(maxdata, scalar[i + ldim * node]);
      }
    }
    tempdata = mindata;
    RSS(ref_mpi_min(ref_mpi, &tempdata, &mindata, REF_DBL_TYPE), "mpi min");
    tempdata = maxdata;
    RSS(ref_mpi_max(ref_mpi, &tempdata, &maxdata, REF_DBL_TYPE), "mpi max");
    if (ref_mpi_once(ref_mpi)) {
      REIS(1, fwrite(&mindata, sizeof(double), 1, file), "mindata");
      REIS(1, fwrite(&maxdata, sizeof(double), 1, file), "maxdata");
    }
  }

  RSS(ref_gather_node_tec_block(ref_node, nnode, l2c, ldim, scalar, dataformat,
                                file),
      "block points");

  RSS(ref_gather_brick_tec(ref_node, ref_cell, ncell, l2c, REF_TRUE, file),
      "c2n");

  ref_free(l2c);
  return REF_SUCCESS;
}